

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_client.cpp
# Opt level: O2

void __thiscall zmq::plain_client_t::produce_hello(plain_client_t *this,msg_t *msg_)

{
  int iVar1;
  ulong uVar2;
  undefined4 *puVar3;
  int *piVar4;
  char *errmsg_;
  string password;
  string username;
  
  std::__cxx11::string::string
            ((string *)&username,
             (string *)&(this->super_mechanism_base_t).super_mechanism_t.options.plain_username);
  if (0xff < CONCAT71(username._M_string_length._1_7_,(undefined1)username._M_string_length)) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","username.length () <= UCHAR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x79);
    fflush(_stderr);
    zmq_abort("username.length () <= UCHAR_MAX");
  }
  std::__cxx11::string::string
            ((string *)&password,
             (string *)&(this->super_mechanism_base_t).super_mechanism_t.options.plain_password);
  uVar2 = CONCAT71(password._M_string_length._1_7_,(undefined1)password._M_string_length);
  if (0xff < uVar2) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","password.length () <= UCHAR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x7c);
    fflush(_stderr);
    zmq_abort("password.length () <= UCHAR_MAX");
    uVar2 = CONCAT71(password._M_string_length._1_7_,(undefined1)password._M_string_length);
  }
  iVar1 = msg_t::init_size(msg_,CONCAT71(username._M_string_length._1_7_,
                                         (undefined1)username._M_string_length) + uVar2 + 8);
  if (iVar1 != 0) {
    piVar4 = __errno_location();
    errmsg_ = strerror(*piVar4);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/plain_client.cpp"
            ,0x83);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  puVar3 = (undefined4 *)msg_t::data(msg_);
  *(undefined2 *)(puVar3 + 1) = 0x4f4c;
  *puVar3 = 0x4c454805;
  *(undefined1 *)((long)puVar3 + 6) = (undefined1)username._M_string_length;
  memcpy((void *)((long)puVar3 + 7),username._M_dataplus._M_p,
         CONCAT71(username._M_string_length._1_7_,(undefined1)username._M_string_length));
  *(undefined1 *)
   ((long)puVar3 +
   CONCAT71(username._M_string_length._1_7_,(undefined1)username._M_string_length) + 7) =
       (undefined1)password._M_string_length;
  memcpy((void *)((long)puVar3 +
                 CONCAT71(username._M_string_length._1_7_,(undefined1)username._M_string_length) + 8
                 ),password._M_dataplus._M_p,
         CONCAT71(password._M_string_length._1_7_,(undefined1)password._M_string_length));
  std::__cxx11::string::~string((string *)&password);
  std::__cxx11::string::~string((string *)&username);
  return;
}

Assistant:

void zmq::plain_client_t::produce_hello (msg_t *msg_) const
{
    const std::string username = options.plain_username;
    zmq_assert (username.length () <= UCHAR_MAX);

    const std::string password = options.plain_password;
    zmq_assert (password.length () <= UCHAR_MAX);

    const size_t command_size = hello_prefix_len + brief_len_size
                                + username.length () + brief_len_size
                                + password.length ();

    const int rc = msg_->init_size (command_size);
    errno_assert (rc == 0);

    unsigned char *ptr = static_cast<unsigned char *> (msg_->data ());
    memcpy (ptr, hello_prefix, hello_prefix_len);
    ptr += hello_prefix_len;

    *ptr++ = static_cast<unsigned char> (username.length ());
    memcpy (ptr, username.c_str (), username.length ());
    ptr += username.length ();

    *ptr++ = static_cast<unsigned char> (password.length ());
    memcpy (ptr, password.c_str (), password.length ());
}